

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.cpp
# Opt level: O1

string * __thiscall
duckdb::VectorTypeToString_abi_cxx11_(string *__return_storage_ptr__,duckdb *this,VectorType type)

{
  char *pcVar1;
  char *pcVar2;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  switch((ulong)this & 0xffffffff) {
  case 0:
    pcVar2 = "FLAT";
    pcVar1 = "";
    break;
  case 1:
    pcVar2 = "FSST";
    pcVar1 = "";
    break;
  case 2:
    pcVar2 = "CONSTANT";
    pcVar1 = "";
    break;
  case 3:
    pcVar2 = "DICTIONARY";
    pcVar1 = "";
    break;
  case 4:
    pcVar2 = "SEQUENCE";
    pcVar1 = "";
    break;
  default:
    pcVar2 = "UNKNOWN";
    pcVar1 = "";
  }
  ::std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar2,pcVar1);
  return __return_storage_ptr__;
}

Assistant:

string VectorTypeToString(VectorType type) {
	switch (type) {
	case VectorType::FLAT_VECTOR:
		return "FLAT";
	case VectorType::FSST_VECTOR:
		return "FSST";
	case VectorType::SEQUENCE_VECTOR:
		return "SEQUENCE";
	case VectorType::DICTIONARY_VECTOR:
		return "DICTIONARY";
	case VectorType::CONSTANT_VECTOR:
		return "CONSTANT";
	default:
		return "UNKNOWN";
	}
}